

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::SwitchMixin<(unsigned_char)'\x04'>::Print
          (SwitchMixin<(unsigned_char)__x04_> *this,DebugWriter *w,char16 *litbuf)

{
  byte local_21;
  uint8 i;
  char16 *litbuf_local;
  DebugWriter *w_local;
  SwitchMixin<(unsigned_char)__x04_> *this_local;
  
  DebugWriter::EOL(w);
  DebugWriter::Indent(w);
  for (local_21 = 0; local_21 < this->numCases; local_21 = local_21 + 1) {
    SwitchCase::Print(this->cases + local_21,w);
  }
  DebugWriter::Unindent(w);
  return;
}

Assistant:

void SwitchMixin<n>::Print(DebugWriter* w, const char16* litbuf) const
    {
        w->EOL();
        w->Indent();
        for (uint8 i = 0; i < numCases; i++)
        {
            cases[i].Print(w);
        }
        w->Unindent();
    }